

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O2

int xmlconfTestCases(xmlDocPtr doc,xmlNodePtr cur,int level)

{
  xmlNodePtr cur_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *__s2;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  _xmlNode **pp_Var12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  xmlDocPtr doc_1;
  int level_00;
  uint uVar17;
  char **ppcVar18;
  char *local_288;
  xmlParserCtxtPtr ctxt;
  long local_268;
  long local_260;
  long local_240;
  char buf [500];
  
  level_00 = 2;
  if (level == 1) {
    lVar5 = xmlGetProp(cur,"PROFILE");
    if (lVar5 != 0) {
      printf("Test cases: %s\n",lVar5);
      (*_xmlFree)(lVar5);
      bVar2 = 1;
      goto LAB_00102825;
    }
    level_00 = 1;
  }
  bVar2 = 0;
LAB_00102825:
  pp_Var12 = &cur->children;
  iVar15 = 0;
  uVar14 = 0;
  do {
    cur_00 = *pp_Var12;
    if (cur_00 == (xmlNodePtr)0x0) {
      if ((bool)(bVar2 & 0 < (int)uVar14)) {
        printf("Test cases: %d tests\n",(ulong)uVar14);
      }
      return iVar15;
    }
    if (cur_00->type == XML_ELEMENT_NODE) {
      iVar3 = xmlStrEqual(cur_00->name,"TESTCASES");
      if (iVar3 == 0) {
        iVar3 = xmlStrEqual(cur_00->name,"TEST");
        if (iVar3 == 0) {
          fprintf(_stderr,"Unhandled element %s\n",cur_00->name);
        }
        else {
          testErrorsSize = 0;
          nbError = 0;
          testErrors[0] = '\0';
          nbFatal = 0;
          __s2 = (char *)xmlGetProp(cur_00,"ID");
          if (__s2 == (char *)0x0) {
            uVar6 = xmlGetLineNo(cur_00);
            test_log("test missing ID, line %ld\n",uVar6);
          }
          else {
            ppcVar18 = skipped_tests;
            do {
              if (*ppcVar18 == (char *)0x0) {
                lVar5 = xmlGetProp(cur_00,"TYPE");
                if (lVar5 == 0) {
                  test_log("test %s missing TYPE\n",__s2);
                  uVar17 = 0xffffffff;
                  goto LAB_00102ae1;
                }
                pcVar7 = (char *)xmlGetProp(cur_00,"URI");
                if (pcVar7 == (char *)0x0) {
                  test_log("test %s missing URI\n",__s2);
                  local_288 = (char *)0x0;
                  local_240 = 0;
LAB_00102b50:
                  lVar9 = 0;
                  local_260 = 0;
                  lVar8 = 0;
                  local_268 = 0;
                  uVar17 = 0xffffffff;
                }
                else {
                  local_240 = xmlNodeGetBase(doc,cur_00);
                  pcVar13 = pcVar7;
                  if (local_240 != 0) {
                    pcVar13 = buf;
                    snprintf(pcVar13,500,"%s/%s",local_240,pcVar7);
                  }
                  local_288 = (char *)xmlStrdup(pcVar13);
                  iVar3 = checkTestFile(local_288);
                  if (iVar3 == 0) {
                    pcVar13 = local_288;
                    if (local_288 == (char *)0x0) {
                      pcVar13 = "NULL";
                    }
                    test_log("test %s missing file %s \n",__s2,pcVar13);
                    goto LAB_00102b50;
                  }
                  local_260 = xmlGetProp(cur_00,"VERSION");
                  lVar8 = xmlGetProp(cur_00,"ENTITIES");
                  iVar3 = xmlStrEqual(lVar8,"none");
                  uVar16 = 0;
                  if (iVar3 == 0) {
                    uVar16 = 6;
                  }
                  lVar9 = xmlGetProp(cur_00,"RECOMMENDATION");
                  if ((((lVar9 == 0) || (iVar3 = xmlStrEqual(lVar9,"XML1.0"), iVar3 != 0)) ||
                      (iVar3 = xmlStrEqual(lVar9,"XML1.0-errata2e"), iVar3 != 0)) ||
                     ((iVar3 = xmlStrEqual(lVar9,"XML1.0-errata3e"), iVar3 != 0 ||
                      (iVar3 = xmlStrEqual(lVar9,"XML1.0-errata4e"), iVar3 != 0)))) {
                    bVar1 = true;
                    if ((local_260 == 0) || (iVar3 = xmlStrEqual(local_260,"1.0"), iVar3 != 0))
                    goto LAB_00102b96;
                    local_268 = 0;
                    test_log("Skipping test %s for %s\n",__s2,local_260);
                    nb_skipped = nb_skipped + 1;
                    uVar17 = 0;
                  }
                  else {
                    iVar3 = xmlStrEqual(lVar9,"NS1.0");
                    if (iVar3 == 0) {
                      iVar3 = xmlStrEqual(lVar9,"NS1.0-errata1e");
                      uVar17 = 0;
                      bVar1 = false;
                      if (iVar3 == 0) {
                        test_log("Skipping test %s for REC %s\n",__s2,lVar9);
                        nb_skipped = nb_skipped + 1;
                        local_268 = 0;
                        goto LAB_00102ef7;
                      }
                    }
                    else {
                      bVar1 = false;
                    }
LAB_00102b96:
                    local_268 = xmlGetProp(cur_00,"EDITION");
                    uVar17 = uVar16;
                    if (local_268 != 0) {
                      lVar10 = xmlStrchr(local_268,0x35);
                      uVar17 = uVar16 + 0x20000;
                      if (lVar10 != 0) {
                        uVar17 = uVar16;
                      }
                    }
                    xmlResetLastError();
                    testErrorsSize = 0;
                    testErrors[0] = '\0';
                    iVar3 = xmlMemUsed();
                    iVar4 = xmlStrEqual(lVar5,"not-wf");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(lVar5,"valid");
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(lVar5,"invalid");
                        if (iVar4 == 0) {
                          iVar3 = xmlStrEqual(lVar5,"error");
                          if (iVar3 == 0) {
                            test_log("test %s unknown TYPE value %s\n",__s2,lVar5);
                            uVar17 = 0xffffffff;
                          }
                          else {
                            uVar17 = 0;
                            test_log("Skipping error test %s \n",__s2);
                            nb_skipped = nb_skipped + 1;
                          }
                          goto LAB_00102ef7;
                        }
                        ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
                        if (ctxt == (xmlParserCtxtPtr)0x0) goto LAB_00102df7;
                        xmlCtxtSetErrorHandler(ctxt,testErrorHandler,0);
                        lVar10 = xmlCtxtReadFile(ctxt,local_288,0,uVar17 | 0x10);
                        if (lVar10 != 0) {
                          if ((ctxt->valid != 0) || ((*(byte *)(lVar10 + 0xac) & 8) != 0)) {
                            pcVar13 = "test %s : %s failed to detect invalid document\n";
                            goto LAB_00102dcf;
                          }
                          goto LAB_00102dea;
                        }
                        test_log("test %s : %s invalid document turned not well-formed too\n",__s2,
                                 local_288);
                      }
                      else {
                        ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
                        if (ctxt == (xmlParserCtxtPtr)0x0) {
LAB_00102df7:
                          test_log("test %s : %s out of memory\n",__s2,local_288);
                          goto LAB_00102eb9;
                        }
                        xmlCtxtSetErrorHandler(ctxt,testErrorHandler,0);
                        lVar10 = xmlCtxtReadFile(ctxt,local_288,0,uVar17 | 0x10);
                        if (lVar10 == 0) {
                          test_log("test %s : %s failed to parse a valid document\n",__s2,local_288)
                          ;
                          nb_errors = nb_errors + 1;
                        }
                        else {
                          if ((ctxt->valid == 0) || ((*(byte *)(lVar10 + 0xac) & 8) == 0)) {
                            pcVar13 = "test %s : %s failed to validate a valid document\n";
LAB_00102dcf:
                            test_log(pcVar13,__s2,local_288);
                            nb_errors = nb_errors + 1;
                          }
LAB_00102dea:
                          xmlFreeDoc(lVar10);
                        }
                      }
LAB_00102eb4:
                      xmlFreeParserCtxt(ctxt);
                    }
                    else {
                      ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
                      xmlCtxtSetErrorHandler(ctxt,testErrorHandler,0);
                      lVar10 = xmlCtxtReadFile(ctxt,local_288,0,uVar17);
                      if (!bVar1) {
                        if (lVar10 == 0) {
                          test_log("test %s : %s failed to parse the XML\n",__s2,local_288);
                          nb_errors = nb_errors + 1;
                        }
                        else {
                          piVar11 = (int *)xmlGetLastError();
                          if ((piVar11[1] == 0) || (*piVar11 != 3)) {
                            test_log("test %s : %s failed to detect namespace error\n",__s2,
                                     local_288);
                            nb_errors = nb_errors + 1;
                          }
                          xmlFreeDoc(lVar10);
                        }
                        goto LAB_00102eb4;
                      }
                      if (lVar10 != 0) {
                        test_log("test %s : %s failed to detect not well formedness\n",__s2,
                                 local_288);
                        nb_errors = nb_errors + 1;
                        xmlFreeDoc(lVar10);
                      }
                      xmlFreeParserCtxt(ctxt);
                    }
LAB_00102eb9:
                    xmlResetLastError();
                    iVar4 = xmlMemUsed();
                    if (iVar4 - iVar3 != 0 && iVar3 <= iVar4) {
                      test_log("test %s : %s leaked %d bytes\n",__s2,local_288,
                               (ulong)(uint)(iVar4 - iVar3));
                      nb_leaks = nb_leaks + 1;
                    }
                    nb_tests = nb_tests + 1;
                    uVar17 = 1;
                  }
                }
LAB_00102ef7:
                (*_xmlFree)(lVar5);
                if (lVar8 != 0) {
                  (*_xmlFree)(lVar8);
                }
                if (local_268 != 0) {
                  (*_xmlFree)();
                }
                if (local_260 != 0) {
                  (*_xmlFree)();
                }
                if (local_288 != (char *)0x0) {
                  (*_xmlFree)();
                }
                if (pcVar7 != (char *)0x0) {
                  (*_xmlFree)();
                }
                if (local_240 != 0) {
                  (*_xmlFree)();
                }
                goto LAB_00102f7a;
              }
              iVar3 = strcmp(*ppcVar18,__s2);
              ppcVar18 = ppcVar18 + 1;
            } while (iVar3 != 0);
            uVar17 = 0;
            test_log("Skipping test %s from skipped list\n",__s2);
            nb_skipped = nb_skipped + 1;
LAB_00102ae1:
            lVar9 = 0;
LAB_00102f7a:
            (*_xmlFree)(__s2);
            if (lVar9 != 0) {
              (*_xmlFree)(lVar9);
            }
            iVar15 = iVar15 - ((int)~uVar17 >> 0x1f);
          }
          uVar14 = uVar14 + 1;
        }
      }
      else {
        iVar3 = xmlconfTestCases(doc,cur_00,level_00);
        iVar15 = iVar15 + iVar3;
      }
    }
    pp_Var12 = &cur_00->next;
  } while( true );
}

Assistant:

static int
xmlconfTestCases(xmlDocPtr doc, xmlNodePtr cur, int level) {
    xmlChar *profile;
    int ret = 0;
    int tests = 0;
    int output = 0;

    if (level == 1) {
	profile = xmlGetProp(cur, BAD_CAST "PROFILE");
	if (profile != NULL) {
	    output = 1;
	    level++;
	    printf("Test cases: %s\n", (char *) profile);
	    xmlFree(profile);
	}
    }
    cur = cur->children;
    while (cur != NULL) {
        /* look only at elements we ignore everything else */
        if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlStrEqual(cur->name, BAD_CAST "TESTCASES")) {
	        ret += xmlconfTestCases(doc, cur, level);
	    } else if (xmlStrEqual(cur->name, BAD_CAST "TEST")) {
	        if (xmlconfTestItem(doc, cur) >= 0)
		    ret++;
		tests++;
	    } else {
	        fprintf(stderr, "Unhandled element %s\n", (char *)cur->name);
	    }
	}
        cur = cur->next;
    }
    if (output == 1) {
	if (tests > 0)
	    printf("Test cases: %d tests\n", tests);
    }
    return(ret);
}